

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringencode.cc
# Opt level: O3

size_t rtc::utf8_decode(char *source,size_t srclen,unsigned_long *value)

{
  byte bVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  uchar *s;
  uint uVar5;
  
  bVar1 = *source;
  uVar4 = (ulong)bVar1;
  uVar3 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    if ((srclen < 2) || ((source[1] & 0xc0U) != 0x80)) {
      return 0;
    }
    uVar5 = (byte)source[1] & 0x3f;
    if ((bVar1 & 0xe0) == 0xc0) {
      uVar4 = (ulong)(uVar5 | (uVar3 & 0x1f) << 6);
      sVar2 = 2;
    }
    else {
      if (srclen == 2) {
        return 0;
      }
      if ((source[2] & 0xc0U) != 0x80) {
        return 0;
      }
      uVar5 = (byte)source[2] & 0x3f | uVar5 << 6;
      if ((bVar1 & 0xf0) == 0xe0) {
        uVar4 = (ulong)(uVar5 | (uVar3 & 0xf) << 0xc);
        sVar2 = 3;
      }
      else {
        if (srclen < 4) {
          return 0;
        }
        if ((bVar1 & 0xf8) != 0xf0 || ((byte)source[3] & 0xffffffc0) != 0x80) {
          return 0;
        }
        uVar4 = (ulong)((uVar3 & 7) << 0x12 | (byte)source[3] & 0x3f | uVar5 << 6);
        sVar2 = 4;
      }
    }
  }
  else {
    sVar2 = 1;
  }
  *value = uVar4;
  return sVar2;
}

Assistant:

size_t utf8_decode(const char* source, size_t srclen, unsigned long* value) {
  const unsigned char* s = reinterpret_cast<const unsigned char*>(source);
  if ((s[0] & 0x80) == 0x00) {                    // Check s[0] == 0xxxxxxx
    *value = s[0];
    return 1;
  }
  if ((srclen < 2) || ((s[1] & 0xC0) != 0x80)) {  // Check s[1] != 10xxxxxx
    return 0;
  }
  // Accumulate the trailer byte values in value16, and combine it with the
  // relevant bits from s[0], once we've determined the sequence length.
  unsigned long value16 = (s[1] & 0x3F);
  if ((s[0] & 0xE0) == 0xC0) {                    // Check s[0] == 110xxxxx
    *value = ((s[0] & 0x1F) << 6) | value16;
    return 2;
  }
  if ((srclen < 3) || ((s[2] & 0xC0) != 0x80)) {  // Check s[2] != 10xxxxxx
    return 0;
  }
  value16 = (value16 << 6) | (s[2] & 0x3F);
  if ((s[0] & 0xF0) == 0xE0) {                    // Check s[0] == 1110xxxx
    *value = ((s[0] & 0x0F) << 12) | value16;
    return 3;
  }
  if ((srclen < 4) || ((s[3] & 0xC0) != 0x80)) {  // Check s[3] != 10xxxxxx
    return 0;
  }
  value16 = (value16 << 6) | (s[3] & 0x3F);
  if ((s[0] & 0xF8) == 0xF0) {                    // Check s[0] == 11110xxx
    *value = ((s[0] & 0x07) << 18) | value16;
    return 4;
  }
  return 0;
}